

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasAkzoNob_dns.c
# Opt level: O2

int res(sunrealtype t,N_Vector yy,N_Vector yd,N_Vector resval,void *userdata)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double *pdVar14;
  double dVar15;
  double dVar16;
  double __x;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  dVar17 = *userdata;
  dVar18 = *(double *)((long)userdata + 8);
  dVar23 = *(double *)((long)userdata + 0x10);
  dVar20 = *(double *)((long)userdata + 0x18);
  uVar1 = *(undefined8 *)((long)userdata + 0x20);
  dVar2 = *(double *)((long)userdata + 0x28);
  dVar3 = *(double *)((long)userdata + 0x30);
  uVar4 = *(undefined8 *)((long)userdata + 0x38);
  uVar5 = *(undefined8 *)((long)userdata + 0x40);
  pdVar14 = *(double **)((long)yy->content + 0x10);
  dVar16 = *pdVar14;
  __x = pdVar14[1];
  dVar6 = pdVar14[2];
  dVar7 = pdVar14[3];
  dVar21 = pdVar14[4];
  dVar8 = pdVar14[5];
  pdVar14 = *(double **)((long)yd->content + 0x10);
  dVar9 = *pdVar14;
  dVar10 = pdVar14[1];
  dVar11 = pdVar14[2];
  dVar12 = pdVar14[3];
  dVar13 = pdVar14[4];
  dVar15 = (double)SUNRpowerI(SUB84(dVar16,0),4);
  dVar19 = 0.0;
  dVar22 = 0.0;
  if ((0.0 < __x) && (dVar19 = SQRT(__x), dVar22 = dVar19, __x < 0.0)) {
    dVar19 = sqrt(__x);
    dVar22 = sqrt(__x);
  }
  dVar22 = dVar20 * dVar8 * dVar8 * dVar22;
  auVar24._8_8_ = dVar18;
  auVar24._0_8_ = uVar4;
  auVar25._8_8_ = uVar1;
  auVar25._0_8_ = uVar5;
  auVar25 = divpd(auVar24,auVar25);
  dVar19 = dVar19 * dVar15 * dVar17;
  dVar20 = dVar7 * dVar6 * dVar18;
  dVar23 = dVar23 * dVar16 * dVar7 * dVar7;
  dVar21 = dVar21 * auVar25._8_8_ * dVar16;
  pdVar14 = *(double **)((long)resval->content + 0x10);
  *pdVar14 = ((dVar19 + dVar19 + dVar9) - dVar20) + dVar21 + dVar23;
  pdVar14[1] = (dVar22 * 0.5 + dVar19 * 0.5 + dVar10 + dVar23) - dVar2 * (auVar25._0_8_ - __x);
  pdVar14[2] = ((dVar11 - dVar19) + dVar20) - dVar21;
  pdVar14[3] = dVar23 + dVar23 + ((dVar12 + dVar20) - dVar21);
  pdVar14[4] = ((dVar13 - dVar20) + dVar21) - dVar22;
  pdVar14[5] = dVar3 * dVar16 * dVar7 - dVar8;
  return 0;
}

Assistant:

static int res(sunrealtype t, N_Vector yy, N_Vector yd, N_Vector resval,
               void* userdata)
{
  UserData data;
  sunrealtype k1, k2, k3, k4;
  sunrealtype K, klA, Ks, pCO2, H;

  sunrealtype y1, y2, y3, y4, y5, y6;
  sunrealtype yd1, yd2, yd3, yd4, yd5;

  sunrealtype r1, r2, r3, r4, r5, Fin;

  data = (UserData)userdata;
  k1   = data->k1;
  k2   = data->k2;
  k3   = data->k3;
  k4   = data->k4;
  K    = data->K;
  klA  = data->klA;
  Ks   = data->Ks;
  pCO2 = data->pCO2;
  H    = data->H;

  y1 = Ith(yy, 1);
  y2 = Ith(yy, 2);
  y3 = Ith(yy, 3);
  y4 = Ith(yy, 4);
  y5 = Ith(yy, 5);
  y6 = Ith(yy, 6);

  yd1 = Ith(yd, 1);
  yd2 = Ith(yd, 2);
  yd3 = Ith(yd, 3);
  yd4 = Ith(yd, 4);
  yd5 = Ith(yd, 5);

  r1  = k1 * SUNRpowerI(y1, 4) * SUNRsqrt(y2);
  r2  = k2 * y3 * y4;
  r3  = k2 / K * y1 * y5;
  r4  = k3 * y1 * y4 * y4;
  r5  = k4 * y6 * y6 * SUNRsqrt(y2);
  Fin = klA * (pCO2 / H - y2);

  Ith(resval, 1) = yd1 + TWO * r1 - r2 + r3 + r4;
  Ith(resval, 2) = yd2 + HALF * r1 + r4 + HALF * r5 - Fin;
  Ith(resval, 3) = yd3 - r1 + r2 - r3;
  Ith(resval, 4) = yd4 + r2 - r3 + TWO * r4;
  Ith(resval, 5) = yd5 - r2 + r3 - r5;
  Ith(resval, 6) = Ks * y1 * y4 - y6;

  return (0);
}